

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llb2Core.c
# Opt level: O3

DdNode * Llb_CoreComputeCube(DdManager *dd,Vec_Int_t *vVars,int fUseVarIndex,char *pValues)

{
  abctime aVar1;
  DdNode *pDVar2;
  ulong uVar3;
  long lVar4;
  int i;
  DdNode *f;
  
  aVar1 = dd->TimeStop;
  dd->TimeStop = 0;
  pDVar2 = Cudd_ReadOne(dd);
  Cudd_Ref(pDVar2);
  if (0 < vVars->nSize) {
    lVar4 = 0;
    f = pDVar2;
    do {
      i = (int)lVar4;
      if (fUseVarIndex != 0) {
        i = vVars->pArray[lVar4];
      }
      pDVar2 = Cudd_bddIthVar(dd,i);
      if (pValues == (char *)0x0) {
        uVar3 = 1;
      }
      else {
        uVar3 = (ulong)(pValues[lVar4] != '\x01');
      }
      pDVar2 = Cudd_bddAnd(dd,f,(DdNode *)(uVar3 ^ (ulong)pDVar2));
      Cudd_Ref(pDVar2);
      Cudd_RecursiveDeref(dd,f);
      lVar4 = lVar4 + 1;
      f = pDVar2;
    } while (lVar4 < vVars->nSize);
  }
  Cudd_Deref(pDVar2);
  dd->TimeStop = aVar1;
  return pDVar2;
}

Assistant:

DdNode * Llb_CoreComputeCube( DdManager * dd, Vec_Int_t * vVars, int fUseVarIndex, char * pValues )
{
    DdNode * bRes, * bVar, * bTemp;
    int i, iVar, Index;
    abctime TimeStop;
    TimeStop = dd->TimeStop; dd->TimeStop = 0;
    bRes = Cudd_ReadOne( dd );   Cudd_Ref( bRes );
    Vec_IntForEachEntry( vVars, Index, i )
    {
        iVar  = fUseVarIndex ? Index : i;
        bVar  = Cudd_NotCond( Cudd_bddIthVar(dd, iVar), (int)(pValues == NULL || pValues[i] != 1) );
        bRes  = Cudd_bddAnd( dd, bTemp = bRes, bVar );  Cudd_Ref( bRes );
        Cudd_RecursiveDeref( dd, bTemp );
    }
    Cudd_Deref( bRes );
    dd->TimeStop = TimeStop;
    return bRes;
}